

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlFloat.cpp
# Opt level: O2

filepos_t __thiscall
libebml::EbmlFloat::RenderData(EbmlFloat *this,IOCallback *output,bool param_2,bool param_3)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  int *Buffer;
  big_int32 TmpToWrite;
  int local_20 [2];
  
  iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])
                    (this,output,CONCAT71(in_register_00000011,param_2),
                     CONCAT71(in_register_00000009,param_3));
  if (CONCAT44(extraout_var,iVar1) != 4) {
    iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
    if (CONCAT44(extraout_var_00,iVar1) != 8) {
      __assert_fail("GetSize() == 4 || GetSize() == 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/ebml/src/EbmlFloat.cpp"
                    ,0x5b,
                    "virtual filepos_t libebml::EbmlFloat::RenderData(IOCallback &, bool, bool)");
    }
  }
  iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
  if (CONCAT44(extraout_var_01,iVar1) == 4) {
    TmpToWrite.platform_value = (int)(float)this->Value;
    Endian<int,_(libebml::endianess)0>::process_endian(&TmpToWrite);
    Buffer = &TmpToWrite.endian_value;
  }
  else {
    iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
    if (CONCAT44(extraout_var_02,iVar1) != 8) goto LAB_0019126d;
    TmpToWrite = (big_int32)this->Value;
    Endian<long,_(libebml::endianess)0>::process_endian
              ((Endian<long,_(libebml::endianess)0> *)&TmpToWrite);
    Buffer = local_20;
  }
  iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
  IOCallback::writeFully(output,Buffer,CONCAT44(extraout_var_03,iVar1));
LAB_0019126d:
  iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
  return CONCAT44(extraout_var_04,iVar1);
}

Assistant:

filepos_t EbmlFloat::RenderData(IOCallback & output, bool /* bForceRender */, bool /* bWithDefault */)
{
  assert(GetSize() == 4 || GetSize() == 8);

  if (GetSize() == 4) {
    float val = Value;
    int Tmp;
    memcpy(&Tmp, &val, 4);
    big_int32 TmpToWrite(Tmp);
    output.writeFully(&TmpToWrite.endian(), GetSize());
  } else if (GetSize() == 8) {
    double val = Value;
    int64 Tmp;
    memcpy(&Tmp, &val, 8);
    big_int64 TmpToWrite(Tmp);
    output.writeFully(&TmpToWrite.endian(), GetSize());
  }

  return GetSize();
}